

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolTable.cpp
# Opt level: O3

void __thiscall glslang::TFunction::~TFunction(TFunction *this)

{
  pointer pTVar1;
  pointer pTVar2;
  
  (this->super_TSymbol)._vptr_TSymbol = (_func_int **)&PTR_clone_00923368;
  pTVar2 = (this->parameters).
           super_vector<glslang::TParameter,_glslang::pool_allocator<glslang::TParameter>_>.
           super__Vector_base<glslang::TParameter,_glslang::pool_allocator<glslang::TParameter>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pTVar1 = (this->parameters).
           super_vector<glslang::TParameter,_glslang::pool_allocator<glslang::TParameter>_>.
           super__Vector_base<glslang::TParameter,_glslang::pool_allocator<glslang::TParameter>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (pTVar2 != pTVar1) {
    do {
      if (pTVar2->type != (TType *)0x0) {
        (*pTVar2->type->_vptr_TType[1])();
        pTVar1 = (this->parameters).
                 super_vector<glslang::TParameter,_glslang::pool_allocator<glslang::TParameter>_>.
                 super__Vector_base<glslang::TParameter,_glslang::pool_allocator<glslang::TParameter>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      }
      pTVar2 = pTVar2 + 1;
    } while (pTVar2 != pTVar1);
  }
  return;
}

Assistant:

TFunction::~TFunction()
{
    for (TParamList::iterator i = parameters.begin(); i != parameters.end(); ++i)
        delete (*i).type;
}